

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O2

bool __thiscall
iDynTree::BerdyHelper::serializeDynamicVariablesFloatingBase
          (BerdyHelper *this,LinkProperAccArray *properAccs,
          LinkNetTotalWrenchesWithoutGravity *param_2,LinkNetExternalWrenches *netExtWrenches,
          LinkInternalWrenches *linkJointWrenches,JointDOFsDoubleArray *param_5,
          JointDOFsDoubleArray *jointAccs,VectorDynSize *d)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  Twist *pTVar5;
  SpatialForceVector *pSVar6;
  long *plVar7;
  undefined8 *puVar8;
  LinkIndex link;
  long lVar9;
  uint localDof;
  ulong uVar10;
  LinkInternalWrenches *subVec;
  IndexRange IVar11;
  IndexRange range;
  IndexRange range_00;
  IndexRange range_01;
  Matrix<double,_6,_1,_0,_6,_1> local_98;
  ClassicalAcc sensorProperAcc;
  
  subVec = linkJointWrenches;
  iDynTree::VectorDynSize::resize((ulong)d);
  lVar9 = 0;
  while( true ) {
    lVar4 = iDynTree::Model::getNrOfLinks();
    if (lVar4 <= lVar9) break;
    pTVar5 = (Twist *)iDynTree::LinkAccArray::operator()(properAccs,lVar9);
    iDynTree::LinkVelArray::operator()(&this->m_linkVels,lVar9);
    iDynTree::ClassicalAcc::fromSpatial((SpatialAcc *)&sensorProperAcc,pTVar5);
    IVar11 = getRangeLinkVariable(this,LINK_BODY_PROPER_CLASSICAL_ACCELERATION,lVar9);
    range.offset = IVar11.size;
    range.size = (ptrdiff_t)&local_98;
    local_98.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
         = (double)&sensorProperAcc;
    setSubVector<Eigen::Map<Eigen::Matrix<double,6,1,0,6,1>,0,Eigen::Stride<0,0>>>
              ((iDynTree *)d,(VectorDynSize *)IVar11.offset,range,
               (Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_> *)subVec);
    IVar11 = getRangeLinkVariable(this,NET_EXT_WRENCH,lVar9);
    range_00.offset = IVar11.size;
    pSVar6 = (SpatialForceVector *)iDynTree::LinkWrenches::operator()(netExtWrenches,lVar9);
    toEigen(&local_98,pSVar6);
    range_00.size = (ptrdiff_t)&local_98;
    setSubVector<Eigen::Matrix<double,6,1,0,6,1>>
              ((iDynTree *)d,(VectorDynSize *)IVar11.offset,range_00,
               (Matrix<double,_6,_1,_0,_6,_1> *)subVec);
    lVar9 = lVar9 + 1;
  }
  lVar9 = 0;
  while( true ) {
    lVar4 = iDynTree::Model::getNrOfJoints();
    if (lVar4 <= lVar9) break;
    plVar7 = (long *)iDynTree::Model::getJoint((long)this);
    lVar4 = iDynTree::Traversal::getChildLinkIndexFromJointIndex
                      ((Model *)&this->m_dynamicsTraversal,(long)this);
    IVar11 = getRangeJointVariable(this,JOINT_WRENCH,lVar9);
    range_01.offset = IVar11.size;
    pSVar6 = (SpatialForceVector *)iDynTree::LinkWrenches::operator()(linkJointWrenches,lVar4);
    toEigen((Matrix<double,_6,_1,_0,_6,_1> *)&sensorProperAcc,pSVar6);
    range_01.size = (ptrdiff_t)&sensorProperAcc;
    setSubVector<Eigen::Matrix<double,6,1,0,6,1>>
              ((iDynTree *)d,(VectorDynSize *)IVar11.offset,range_01,
               (Matrix<double,_6,_1,_0,_6,_1> *)subVec);
    iVar2 = (**(code **)(*plVar7 + 0x20))(plVar7);
    if (iVar2 != 0) {
      uVar10 = 0;
      while( true ) {
        uVar3 = (**(code **)(*plVar7 + 0x20))(plVar7);
        if (uVar3 <= uVar10) break;
        lVar4 = (**(code **)(*plVar7 + 0xc0))(plVar7);
        IVar11 = getRangeDOFVariable(this,DOF_ACCELERATION,lVar4 + uVar10);
        puVar8 = (undefined8 *)
                 iDynTree::VectorDynSize::operator()((VectorDynSize *)jointAccs,lVar4 + uVar10);
        uVar1 = *puVar8;
        puVar8 = (undefined8 *)iDynTree::VectorDynSize::operator()(d,IVar11.offset);
        *puVar8 = uVar1;
        uVar10 = uVar10 + 1;
      }
    }
    lVar9 = lVar9 + 1;
  }
  return true;
}

Assistant:

bool BerdyHelper::serializeDynamicVariablesFloatingBase(LinkProperAccArray& properAccs,
                                                     LinkNetTotalWrenchesWithoutGravity& /*netTotalWrenchesWithoutGrav*/,
                                                     LinkNetExternalWrenches& netExtWrenches,
                                                     LinkInternalWrenches& linkJointWrenches,
                                                     JointDOFsDoubleArray&,
                                                     JointDOFsDoubleArray& jointAccs,
                                                     VectorDynSize& d)
{
    d.resize(this->getNrOfDynamicVariables());
    assert(this->m_options.berdyVariant == BERDY_FLOATING_BASE);

    for (LinkIndex link = 0; link < static_cast<LinkIndex>(m_model.getNrOfLinks()); ++link)
    {
        // Handle acceleration
        // Convert left trivialized proper acceleration to sensor proper acceleration
        ClassicalAcc sensorProperAcc;

        sensorProperAcc.fromSpatial(properAccs(link), m_linkVels(link));
        setSubVector(d, getRangeLinkVariable(LINK_BODY_PROPER_CLASSICAL_ACCELERATION, link), toEigen(sensorProperAcc));

        // Handle external force
        setSubVector(d, getRangeLinkVariable(NET_EXT_WRENCH, link), toEigen(netExtWrenches(link)));

    }

    for (JointIndex jntIdx = 0; jntIdx < static_cast<JointIndex>(m_model.getNrOfJoints()); ++jntIdx)
    {
        IJointPtr joint = m_model.getJoint(jntIdx);

        // Handle joint wrench
        // Warning: for legacy reason linkJointWrenches is addressed using the child link index of its joint
        LinkIndex childLinkIndex = m_dynamicsTraversal.getChildLinkIndexFromJointIndex(m_model, jntIdx);
        setSubVector(d, getRangeJointVariable(JOINT_WRENCH, jntIdx), toEigen(linkJointWrenches(childLinkIndex)));

        // If the joint is not fixed, we also need to serialize the acceleration of the relative dof
        if (joint->getNrOfDOFs() > 0)
        {
            for (unsigned int localDof = 0; localDof < joint->getNrOfDOFs(); localDof++)
            {
                DOFIndex dofIdx =  joint->getDOFsOffset() + localDof;
                setSubVector(d, getRangeDOFVariable(DOF_ACCELERATION, dofIdx), jointAccs(dofIdx));
            }
        }
    }


    return true;
}